

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterable_feature.cc
# Opt level: O0

string * range_to_string<ezy::strong_type<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>const>,____C_A_T_C_H____T_E_S_T____106()::__1_const&>,void,ezy::features::iterable>>
                   (string *__return_storage_ptr__,
                   strong_type<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>,_const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:852:24)_&>,_void,_ezy::features::iterable>
                   *range)

{
  ostringstream local_190 [8];
  ostringstream ostr;
  strong_type<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_const_std::vector<int,_std::allocator<int>_>_>,_const_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_tests_iterable_feature_cc:852:24)_&>,_void,_ezy::features::iterable>
  *range_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  range_to_stream<ezy::strong_type<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,std::vector<int,std::allocator<int>>const>,____C_A_T_C_H____T_E_S_T____106()::__1_const&>,void,ezy::features::iterable>>
            ((ostream *)local_190,range);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string range_to_string(const RangeType& range)
{
  std::ostringstream ostr;
  range_to_stream(ostr, range);
  return ostr.str();
}